

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

Result __thiscall tonk::gateway::SSDPRequester::InitializeSockets(SSDPRequester *this)

{
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  *this_00;
  io_context *owner;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar1;
  pointer __p;
  datagram_socket_service<asio::ip::udp> *pdVar2;
  StateMachine *pSVar3;
  undefined8 *puVar4;
  Result *success;
  int iVar5;
  SSDPRequester *in_RSI;
  long lVar6;
  id *piVar7;
  undefined8 uVar8;
  error_code eVar9;
  error_code ec;
  address bindAddr;
  bad_address_cast ex;
  error_code local_a8;
  undefined1 local_98 [24];
  undefined4 local_80;
  sockaddr local_78;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined **local_50;
  long local_48;
  undefined *local_40 [2];
  
  local_a8._M_value = 0;
  local_a8._M_cat = (error_category *)std::_V2::system_category();
  owner = (in_RSI->Host->Context)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  __p = (pointer)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (__p == (pointer)0x0) {
    __p = (pointer)0x0;
  }
  else {
    local_98._0_8_ =
         &asio::detail::typeid_wrapper<asio::datagram_socket_service<asio::ip::udp>>::typeinfo;
    local_98._8_8_ = (id *)0x0;
    pdVar2 = (datagram_socket_service<asio::ip::udp> *)
             asio::detail::service_registry::do_use_service
                       ((owner->super_execution_context).service_registry_,(key *)local_98,
                        asio::detail::service_registry::
                        create<asio::datagram_socket_service<asio::ip::udp>,asio::io_context>,owner)
    ;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_ = pdVar2;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    protocol_.family_ = 2;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.socket_ = -1;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.state_ = '\0';
  }
  this_00 = &in_RSI->Socket_UDP;
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)this_00,__p);
  if ((in_RSI->Socket_UDP)._M_t.
      super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
      .
      super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
      ._M_head_impl ==
      (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0) {
    local_98._0_8_ = local_98 + 0x10;
    local_98._8_8_ = (id *)0x0;
    local_98[0x10] = '\0';
    pSVar3 = (StateMachine *)operator_new(0x38);
    pSVar3->Host = (AsioHost *)"Out of memory";
    pSVar3->SSDP = (SSDPRequester *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 8);
    (pSVar3->API_Lock).super___mutex_base._M_mutex.__align = 0;
    (pSVar3->API_Lock).super___mutex_base._M_mutex.__size[8] = '\0';
    *(undefined4 *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 0x18) = 0;
    (pSVar3->API_Lock).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x10;
    this->State = pSVar3;
  }
  else {
    local_78.sa_data[6] = '\0';
    local_78.sa_data[7] = '\0';
    local_78.sa_data[8] = '\0';
    local_78.sa_data[9] = '\0';
    local_78.sa_data[10] = '\0';
    local_78.sa_data[0xb] = '\0';
    local_78.sa_data[0xc] = '\0';
    local_78.sa_data[0xd] = '\0';
    uStack_68 = 0;
    uStack_66 = 0;
    uStack_64 = 0;
    local_60 = 0;
    local_78.sa_family = 2;
    local_78.sa_data[0] = '\0';
    local_78.sa_data[1] = '\0';
    local_78.sa_data[2] = '\0';
    local_78.sa_data[3] = '\0';
    local_78.sa_data[4] = '\0';
    local_78.sa_data[5] = '\0';
    if ((in_RSI->State->InterfaceAddress)._M_string_length == 0) {
      local_78.sa_family = 2;
      uStack_66 = 0;
      uStack_64 = 0;
      local_60 = 0;
      local_78.sa_data[0] = '\0';
      local_78.sa_data[1] = '\0';
      local_78.sa_data[2] = '\0';
      local_78.sa_data[3] = '\0';
      local_78.sa_data[4] = '\0';
      local_78.sa_data[5] = '\0';
      local_78.sa_data[6] = '\0';
      local_78.sa_data[7] = '\0';
      local_78.sa_data[8] = '\0';
      local_78.sa_data[9] = '\0';
      local_78.sa_data[10] = '\0';
      local_78.sa_data[0xb] = '\0';
      local_78.sa_data[0xc] = '\0';
      local_78.sa_data[0xd] = '\0';
      uStack_68 = 0;
    }
    else {
      asio::ip::make_address
                ((address *)local_98,(in_RSI->State->InterfaceAddress)._M_dataplus._M_p,&local_a8);
      iVar5 = local_a8._M_value;
      if (local_a8._M_value == 0) {
        if (local_98._0_4_ == ipv6) {
          uVar8 = CONCAT71(local_98._17_7_,local_98[0x10]);
          local_78.sa_data._2_4_ = 0;
          local_78.sa_family = 10;
          piVar7 = (id *)local_98._8_8_;
        }
        else {
          if (local_98._0_4_ != ipv4) {
            local_50 = &PTR__bad_cast_001d3b98;
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = &PTR__bad_cast_001d3b98;
            __cxa_throw(puVar4,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
          }
          uVar8 = 0;
          local_80 = 0;
          local_78.sa_family = 2;
          local_78.sa_data._2_4_ = local_98._4_4_;
          piVar7 = (id *)0x0;
        }
        local_78.sa_data[0] = '\0';
        local_78.sa_data[1] = '\0';
        local_78.sa_data._6_2_ = SUB82(piVar7,0);
        local_78.sa_data._8_2_ = SUB82((ulong)piVar7 >> 0x10,0);
        local_78.sa_data._10_4_ = SUB84((ulong)piVar7 >> 0x20,0);
        uStack_68 = (undefined2)uVar8;
        uStack_66 = (undefined2)((ulong)uVar8 >> 0x10);
        uStack_64 = (undefined4)((ulong)uVar8 >> 0x20);
        local_60 = local_80;
      }
      else {
        (**(code **)(*(long *)local_a8._M_cat + 0x20))(&local_50,local_a8._M_cat,local_a8._M_value);
        lVar6 = (long)local_a8._M_value;
        pSVar3 = (StateMachine *)operator_new(0x38);
        pSVar3->Host = (AsioHost *)"Provided InterfaceAddress was invalid";
        pSVar3->SSDP = (SSDPRequester *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pSVar3->SSDP,local_50,(long)local_50 + local_48);
        *(undefined4 *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 0x18) = 2;
        *(long *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 0x20) = lVar6;
        this->State = pSVar3;
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
      }
      if (iVar5 != 0) {
        return (Result)(ErrorResult *)this;
      }
    }
    pbVar1 = (this_00->_M_t).
             super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             .
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
    iVar5 = (uint)(local_78.sa_family != 2) * 8 + 2;
    eVar9 = asio::detail::reactive_socket_service_base::do_open
                      ((reactive_socket_service_base *)
                       (*(long *)&(pbVar1->
                                  super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                  ).
                                  super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                       + 0x28),(base_implementation_type *)
                               ((long)&(pbVar1->
                                       super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                       ).
                                       super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                               + 8),iVar5,2,0x11,&local_a8);
    if (eVar9._M_value == 0) {
      ((protocol_type *)
      ((long)&(pbVar1->
              super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
              super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> + 0x18))->
      family_ = iVar5;
    }
    if (local_a8._M_value == 0) {
      pbVar1 = (this_00->_M_t).
               super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               .
               super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
               ._M_head_impl;
      local_98._0_4_ = 1;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::boolean<1,2>>
                ((reactive_socket_service<asio::ip::udp> *)
                 (*(long *)&(pbVar1->
                            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                            ).
                            super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                 + 0x28),(implementation_type *)
                         ((long)&(pbVar1->
                                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                                 ).
                                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                         + 8),(boolean<1,_2> *)local_98,&local_a8);
      if (local_a8._M_value == 0) {
        pbVar1 = (this_00->_M_t).
                 super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 .
                 super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
                 ._M_head_impl;
        asio::detail::reactive_socket_service<asio::ip::udp>::bind
                  ((reactive_socket_service<asio::ip::udp> *)
                   (*(long *)&(pbVar1->
                              super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                              ).
                              super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                   + 0x28),(int)pbVar1 + 8,&local_78,(socklen_t)&local_a8);
        if (local_a8._M_value == 0) {
          PostNextRead_UDP(in_RSI);
          this->State = (StateMachine *)0x0;
          return (Result)(ErrorResult *)this;
        }
        (**(code **)(*(long *)local_a8._M_cat + 0x20))(local_98);
        lVar6 = (long)local_a8._M_value;
        pSVar3 = (StateMachine *)operator_new(0x38);
        pSVar3->Host = (AsioHost *)"UDP bind failed";
        pSVar3->SSDP = (SSDPRequester *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pSVar3->SSDP,local_98._0_8_,
                   (type_info *)(local_98._0_8_ + local_98._8_8_));
      }
      else {
        (**(code **)(*(long *)local_a8._M_cat + 0x20))(local_98);
        lVar6 = (long)local_a8._M_value;
        pSVar3 = (StateMachine *)operator_new(0x38);
        pSVar3->Host = (AsioHost *)"UDP socket set_option reuse_address failed";
        pSVar3->SSDP = (SSDPRequester *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pSVar3->SSDP,local_98._0_8_,
                   (type_info *)(local_98._0_8_ + local_98._8_8_));
      }
    }
    else {
      (**(code **)(*(long *)local_a8._M_cat + 0x20))(local_98);
      lVar6 = (long)local_a8._M_value;
      pSVar3 = (StateMachine *)operator_new(0x38);
      pSVar3->Host = (AsioHost *)"UDP socket open failed";
      pSVar3->SSDP = (SSDPRequester *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pSVar3->SSDP,local_98._0_8_,
                 (type_info *)(local_98._0_8_ + local_98._8_8_));
    }
    *(undefined4 *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 0x18) = 2;
    *(long *)((long)&(pSVar3->API_Lock).super___mutex_base._M_mutex + 0x20) = lVar6;
    this->State = pSVar3;
    if ((type_info *)local_98._0_8_ != (type_info *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SSDPRequester::InitializeSockets()
{
    asio::error_code ec;

    Socket_UDP = MakeUniqueNoThrow<asio::ip::udp::socket>(*Host->Context);
    if (!Socket_UDP) {
        return Result::OutOfMemory();
    }

    UDPAddress bindAddress;

    // If application specified an interface address:
    if (State->InterfaceAddress.empty()) {
        // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
        bindAddress = UDPAddress(asio::ip::udp::v4(), 0);
    }
    else
    {
        // Convert provided interface address to Asio address
        const asio::ip::address bindAddr = asio::ip::make_address(State->InterfaceAddress, ec);
        if (ec) {
            return Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
        }

        // Bind to the provided interface address
        bindAddress = UDPAddress(bindAddr, 0);
    }

    Socket_UDP->open(bindAddress.protocol(), ec);
    if (ec) {
        return Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->set_option(asio::socket_base::reuse_address(true), ec);
    if (ec) {
        return Result("UDP socket set_option reuse_address failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->bind(bindAddress, ec);
    if (ec) {
        return Result("UDP bind failed", ec.message(), ErrorType::Asio, ec.value());
    }

    // Start listening
    PostNextRead_UDP();

    return Result::Success();
}